

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler *in_RDI;
  FatalConditionHandlerGuard _;
  FatalConditionHandlerGuard *in_stack_ffffffffffffffe0;
  
  FatalConditionHandlerGuard::FatalConditionHandlerGuard(in_stack_ffffffffffffffe0,in_RDI);
  TestCase::invoke((TestCase *)0x140300);
  FatalConditionHandlerGuard::~FatalConditionHandlerGuard((FatalConditionHandlerGuard *)0x14030c);
  return;
}

Assistant:

void RunContext::invokeActiveTestCase() {
        FatalConditionHandlerGuard _(&m_fatalConditionhandler);
        m_activeTestCase->invoke();
    }